

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda.h
# Opt level: O3

void __thiscall xemmai::t_lambda::t_lambda(t_lambda *this,t_object *a_scope,t_object *a_code)

{
  __pointer_type ptVar1;
  size_t sVar2;
  
  t_slot::t_slot(&this->v_scope,a_scope);
  t_slot::t_slot(&this->v_code,a_code);
  ptVar1 = (this->v_code).v_p._M_b._M_p;
  this->v_arguments = *(size_t *)(ptVar1->v_data + 0x28);
  sVar2 = *(size_t *)(ptVar1->v_data + 0x18);
  this->v_size = *(size_t *)(ptVar1->v_data + 0x10);
  this->v_privates = sVar2;
  this->v_instructions = &(ptVar1[1].v_next)->v_next;
  return;
}

Assistant:

t_lambda(t_object* a_scope, t_object* a_code) : v_scope(a_scope), v_code(a_code)
	{
		auto& code = v_code->f_as<t_code>();
		v_size = code.v_size;
		v_arguments = code.v_arguments;
		v_privates = code.v_privates;
		v_instructions = &code.v_instructions[0];
	}